

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

char * filemgr_latency_stat_name(fdb_latency_stat_type stat)

{
  fdb_latency_stat_type stat_local;
  char *local_8;
  
  switch(stat) {
  case '\0':
    local_8 = "sets            ";
    break;
  case '\x01':
    local_8 = "gets            ";
    break;
  case '\x02':
    local_8 = "commits         ";
    break;
  case '\x03':
    local_8 = "in-mem_snapshot ";
    break;
  case '\x04':
    local_8 = "durable_snapshot";
    break;
  case '\x05':
    local_8 = "compact         ";
    break;
  case '\x06':
    local_8 = "itr-init        ";
    break;
  case '\a':
    local_8 = "itr-seq-ini     ";
    break;
  case '\b':
    local_8 = "itr-next        ";
    break;
  case '\t':
    local_8 = "itr-prev        ";
    break;
  case '\n':
    local_8 = "itr-get         ";
    break;
  case '\v':
    local_8 = "itr-get-meta    ";
    break;
  case '\f':
    local_8 = "itr-seek        ";
    break;
  case '\r':
    local_8 = "itr-seek-max    ";
    break;
  case '\x0e':
    local_8 = "itr-seek-min    ";
    break;
  case '\x0f':
    local_8 = "itr-close       ";
    break;
  case '\x10':
    local_8 = "fdb_open        ";
    break;
  case '\x11':
    local_8 = "fdb_kvs_open    ";
    break;
  case '\x12':
    local_8 = "clone-snapshot  ";
    break;
  default:
    local_8 = (char *)0x0;
  }
  return local_8;
}

Assistant:

const char *filemgr_latency_stat_name(fdb_latency_stat_type stat)
{
    switch(stat) {
        case FDB_LATENCY_SETS:          return "sets            ";
        case FDB_LATENCY_GETS:          return "gets            ";
        case FDB_LATENCY_SNAP_INMEM:    return "in-mem_snapshot ";
        case FDB_LATENCY_SNAP_DUR:      return "durable_snapshot";
        case FDB_LATENCY_COMMITS:       return "commits         ";
        case FDB_LATENCY_COMPACTS:      return "compact         ";
        case FDB_LATENCY_ITR_INIT:      return "itr-init        ";
        case FDB_LATENCY_ITR_SEQ_INIT:  return "itr-seq-ini     ";
        case FDB_LATENCY_ITR_NEXT:      return "itr-next        ";
        case FDB_LATENCY_ITR_PREV:      return "itr-prev        ";
        case FDB_LATENCY_ITR_GET:       return "itr-get         ";
        case FDB_LATENCY_ITR_GET_META:  return "itr-get-meta    ";
        case FDB_LATENCY_ITR_SEEK:      return "itr-seek        ";
        case FDB_LATENCY_ITR_SEEK_MAX:  return "itr-seek-max    ";
        case FDB_LATENCY_ITR_SEEK_MIN:  return "itr-seek-min    ";
        case FDB_LATENCY_ITR_CLOSE:     return "itr-close       ";
        case FDB_LATENCY_OPEN:          return "fdb_open        ";
        case FDB_LATENCY_KVS_OPEN:      return "fdb_kvs_open    ";
        case FDB_LATENCY_SNAP_CLONE:    return "clone-snapshot  ";
    }
    return NULL;
}